

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmap.h
# Opt level: O0

void __thiscall allocmap::markused(allocmap *this,uint32_t ofs,uint32_t size,char *tag)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  pointer ppVar9;
  undefined8 *puVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar11;
  _Self local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  pair<const_unsigned_int,_unsigned_int> local_c0;
  _Base_ptr local_b8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> ins;
  _Self local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Self local_68;
  _Base_ptr local_60;
  _Self local_58;
  iterator next;
  pair<const_unsigned_int,_unsigned_int> local_40;
  _Self local_38;
  _Self local_30;
  iterator i;
  uint32_t end;
  char *tag_local;
  uint32_t size_local;
  uint32_t ofs_local;
  allocmap *this_local;
  
  if (size != 0) {
    i._M_node._4_4_ = ofs + size;
    tag_local._0_4_ = size;
    tag_local._4_4_ = ofs;
    _size_local = this;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::upper_bound(&this->_m,(key_type *)((long)&tag_local + 4));
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::begin(&this->_m);
    bVar5 = std::operator==(&local_30,&local_38);
    if (bVar5) {
      std::pair<const_unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                (&local_40,(uint *)((long)&tag_local + 4),(uint *)&tag_local);
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::insert(&this->_m,&local_40);
    }
    else {
      local_58._M_node = local_30._M_node;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator--(&local_30);
      local_60 = local_30._M_node;
      uVar7 = endofs((iterator)local_30._M_node);
      if (uVar7 == tag_local._4_4_) {
        local_68._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end(&this->_m);
        bVar6 = std::operator!=(&local_58,&local_68);
        uVar1 = i._M_node._4_4_;
        bVar5 = false;
        if (bVar6) {
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_58);
          bVar5 = ppVar9->first < uVar1;
        }
        uVar4 = tag_local._4_4_;
        uVar1 = i._M_node._4_4_;
        if (bVar5) {
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_30);
          uVar2 = ppVar9->first;
          local_70 = local_30._M_node;
          uVar7 = endofs((iterator)local_30._M_node);
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_58);
          uVar3 = ppVar9->first;
          local_78 = local_58._M_node;
          uVar8 = endofs((iterator)local_58._M_node);
          printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)uVar4,(ulong)uVar1,
                 (ulong)uVar2,(ulong)uVar7,(ulong)uVar3,uVar8);
        }
        uVar7 = (uint32_t)tag_local;
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                           (&local_30);
        ppVar9->second = uVar7 + ppVar9->second;
      }
      else {
        local_80 = local_30._M_node;
        uVar7 = endofs((iterator)local_30._M_node);
        uVar4 = tag_local._4_4_;
        uVar1 = i._M_node._4_4_;
        if (tag_local._4_4_ < uVar7) {
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_30);
          uVar2 = ppVar9->first;
          local_88 = local_30._M_node;
          uVar7 = endofs((iterator)local_30._M_node);
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_58);
          uVar3 = ppVar9->first;
          local_90 = local_58._M_node;
          uVar8 = endofs((iterator)local_58._M_node);
          printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)uVar4,(ulong)uVar1,
                 (ulong)uVar2,(ulong)uVar7,(ulong)uVar3,uVar8);
        }
        else {
          local_98._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end(&this->_m);
          bVar6 = std::operator!=(&local_58,&local_98);
          uVar1 = i._M_node._4_4_;
          bVar5 = false;
          if (bVar6) {
            ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                     operator->(&local_58);
            bVar5 = ppVar9->first < uVar1;
          }
          uVar4 = tag_local._4_4_;
          uVar1 = i._M_node._4_4_;
          if (bVar5) {
            ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                     operator->(&local_30);
            uVar2 = ppVar9->first;
            uVar7 = endofs((iterator)local_30._M_node);
            ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                     operator->(&local_58);
            uVar3 = ppVar9->first;
            ins._8_8_ = local_58._M_node;
            uVar8 = endofs((iterator)local_58._M_node);
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)uVar4,(ulong)uVar1
                   ,(ulong)uVar2,(ulong)uVar7,(ulong)uVar3,uVar8);
          }
          std::pair<const_unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                    (&local_c0,(uint *)((long)&tag_local + 4),(uint *)&tag_local);
          pVar11 = std::
                   map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::insert(&this->_m,&local_c0);
          local_d0 = (_Base_ptr)pVar11.first._M_node;
          local_c8 = pVar11.second;
          local_b8 = local_d0;
          ins.first._M_node._0_1_ = local_c8;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            puVar10 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar10 = "failed to free";
            __cxa_throw(puVar10,&char_const*::typeinfo,0);
          }
          local_58._M_node = local_d0;
          local_30._M_node = local_d0;
          std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++
                    (&local_58);
        }
      }
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(&this->_m);
      bVar5 = std::operator==(&local_58,&local_d8);
      if (!bVar5) {
        uVar7 = endofs((iterator)local_30._M_node);
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                           (&local_58);
        if (uVar7 == ppVar9->first) {
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_58);
          uVar1 = ppVar9->second;
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_30);
          ppVar9->second = uVar1 + ppVar9->second;
          std::
          map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)this,(iterator)local_58._M_node);
        }
        else {
          uVar7 = endofs((iterator)local_30._M_node);
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             (&local_58);
          uVar4 = tag_local._4_4_;
          uVar1 = i._M_node._4_4_;
          if (ppVar9->first < uVar7) {
            ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                     operator->(&local_30);
            uVar2 = ppVar9->first;
            uVar7 = endofs((iterator)local_30._M_node);
            ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                     operator->(&local_58);
            uVar3 = ppVar9->first;
            uVar8 = endofs((iterator)local_58._M_node);
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)uVar4,(ulong)uVar1
                   ,(ulong)uVar2,(ulong)uVar7,(ulong)uVar3,uVar8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void markused(uint32_t ofs, uint32_t size, const char *tag)
    {
//        printf("mark %08x-%08x (%8x): %s\n", ofs, ofs+size, size, tag);
        if (size==0)
            return;
        uint32_t end= ofs+size;
        //printf("used(%08x-%08x) %s\n", ofs, end, tag);

        auto i= _m.upper_bound(ofs);
        if (i==_m.begin()) {
            // first item
            _m.insert(allocmap_t::value_type(ofs, size));
            return;
        }
        auto next= i;
        --i;
        // now  i->first <= ofs  < (i+1)->first

        if (endofs(i)==ofs) {
            //  --------<.......>----------<....>
            //          i      ie
            //                 ofs...end
            if (next!=_m.end() && end > next->first)
                printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
                //throw "overlap";
            i->second += size;
        }
        else if (endofs(i) > ofs) {
            //  --------<.......>----------<....>
            //          i      ie
            //               ofs...end
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
            //throw "overlap";
        }
        else {
            //  --------<.......>----------<....>
            //          i      ie
            //                    ofs...end
            if (next!=_m.end() && end > next->first) {
                //  --------<.......>----------<......>
                //          i      ie
                //                    ofs........end
                
                printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
                //throw "overlap";
            }
            auto ins= _m.insert(allocmap_t::value_type(ofs, size));
            if (!ins.second)
                throw "failed to free";
            i= ins.first;

            next= i; ++next;
        }

        if (next==_m.end())
            return;

        // now check if we need to merge with 'next'
        if (endofs(i) == next->first) {
            i->second += next->second;
            _m.erase(next);
        }
        else if (endofs(i) > next->first) {
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
            //throw "overlap";
        }
    }